

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O0

bool __thiscall test_suite::detail::simple_runner::success(simple_runner *this)

{
  simple_runner *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (this->all_).failed.super___atomic_base<unsigned_long>._M_i == 0;
}

Assistant:

bool
  success() const noexcept
  {
    return all_.failed.load() == 0;
  }